

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

ON_BoundingBox * Internal_BoundingBoxInit(ON_BoundingBox *__return_storage_ptr__,double x)

{
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  (__return_storage_ptr__->m_min).z = x;
  (__return_storage_ptr__->m_max).x = x;
  (__return_storage_ptr__->m_min).x = x;
  (__return_storage_ptr__->m_min).y = x;
  (__return_storage_ptr__->m_max).y = x;
  (__return_storage_ptr__->m_max).z = x;
  return __return_storage_ptr__;
}

Assistant:

static ON_BoundingBox Internal_BoundingBoxInit(double x)
{
  ON_BoundingBox bbox;
  bbox.m_min.x = x;
  bbox.m_min.y = x;
  bbox.m_min.z = x;
  bbox.m_max.x = x;
  bbox.m_max.y = x;
  bbox.m_max.z = x;
  return bbox;
}